

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTruth.c
# Opt level: O0

int Gia_Truth5ToGia(Gia_Man_t *p,int *pVarLits,int nVars,uint Truth,int fHash)

{
  int iVar1;
  uint uVar2;
  int iData1;
  int Lit1;
  int Lit0;
  int Var;
  int fHash_local;
  uint Truth_local;
  int nVars_local;
  int *pVarLits_local;
  Gia_Man_t *p_local;
  
  if (Truth == 0) {
    p_local._4_4_ = 0;
  }
  else if (Truth == 0xffffffff) {
    p_local._4_4_ = 1;
  }
  else {
    if (nVars < 1) {
      __assert_fail("nVars > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaTruth.c"
                    ,0x95,"int Gia_Truth5ToGia(Gia_Man_t *, int *, int, unsigned int, int)");
    }
    Lit1 = nVars + -1;
    while ((-1 < Lit1 && (iVar1 = Abc_Tt5HasVar(Truth,Lit1), iVar1 == 0))) {
      Lit1 = Lit1 + -1;
    }
    if (Lit1 < 0) {
      __assert_fail("Var >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaTruth.c"
                    ,0x9a,"int Gia_Truth5ToGia(Gia_Man_t *, int *, int, unsigned int, int)");
    }
    uVar2 = Abc_Tt5Cofactor0(Truth,Lit1);
    iVar1 = Gia_Truth5ToGia(p,pVarLits,Lit1,uVar2,fHash);
    uVar2 = Abc_Tt5Cofactor1(Truth,Lit1);
    iData1 = Gia_Truth5ToGia(p,pVarLits,Lit1,uVar2,fHash);
    if (fHash == 0) {
      p_local._4_4_ = Gia_ManAppendMux(p,pVarLits[Lit1],iData1,iVar1);
    }
    else {
      p_local._4_4_ = Gia_ManHashMux(p,pVarLits[Lit1],iData1,iVar1);
    }
  }
  return p_local._4_4_;
}

Assistant:

int Gia_Truth5ToGia( Gia_Man_t * p, int * pVarLits, int nVars, unsigned Truth, int fHash )
{
    int Var, Lit0, Lit1; 
    if ( Truth == 0 )
        return 0;
    if ( ~Truth == 0 )
        return 1;
    assert( nVars > 0 );
    // find the topmost var
    for ( Var = nVars-1; Var >= 0; Var-- )
        if ( Abc_Tt5HasVar( Truth, Var ) )
             break;
    assert( Var >= 0 );
    // cofactor
    Lit0 = Gia_Truth5ToGia( p, pVarLits, Var, Abc_Tt5Cofactor0(Truth, Var), fHash );
    Lit1 = Gia_Truth5ToGia( p, pVarLits, Var, Abc_Tt5Cofactor1(Truth, Var), fHash );
    if ( fHash )
        return Gia_ManHashMux( p, pVarLits[Var], Lit1, Lit0 );
    else
        return Gia_ManAppendMux( p, pVarLits[Var], Lit1, Lit0 );
}